

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanTargets(Cleaner *this,int target_count,char **targets)

{
  StringPiece path;
  bool bVar1;
  Node *target;
  ulong uVar2;
  string err;
  string target_name;
  uint64_t slash_bits;
  string local_78;
  string local_58;
  uint64_t local_38;
  
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  if (target_count < 1) {
    target_count = 0;
  }
  uVar2 = 0;
  do {
    if ((uint)target_count == uVar2) {
      PrintFooter(this);
      return this->status_;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,targets[uVar2],(allocator<char> *)&local_78);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    bVar1 = CanonicalizePath(&local_58,&local_38,&local_78);
    if (bVar1) {
      path.len_ = local_58._M_string_length;
      path.str_ = local_58._M_dataplus._M_p;
      target = State::LookupNode(this->state_,path);
      if (target == (Node *)0x0) {
        Error("unknown target \'%s\'",local_58._M_dataplus._M_p);
        goto LAB_00167095;
      }
      bVar1 = IsVerbose(this);
      if (bVar1) {
        printf("Target %s\n",local_58._M_dataplus._M_p);
      }
      DoCleanTarget(this,target);
    }
    else {
      Error("failed to canonicalize \'%s\': %s",local_58._M_dataplus._M_p,local_78._M_dataplus._M_p)
      ;
LAB_00167095:
      this->status_ = 1;
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int Cleaner::CleanTargets(int target_count, char* targets[]) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < target_count; ++i) {
    string target_name = targets[i];
    uint64_t slash_bits;
    string err;
    if (!CanonicalizePath(&target_name, &slash_bits, &err)) {
      Error("failed to canonicalize '%s': %s", target_name.c_str(), err.c_str());
      status_ = 1;
    } else {
      Node* target = state_->LookupNode(target_name);
      if (target) {
        if (IsVerbose())
          printf("Target %s\n", target_name.c_str());
        DoCleanTarget(target);
      } else {
        Error("unknown target '%s'", target_name.c_str());
        status_ = 1;
      }
    }
  }
  PrintFooter();
  return status_;
}